

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirePdu.cpp
# Opt level: O3

void __thiscall DIS::FirePdu::FirePdu(FirePdu *this)

{
  WarfareFamilyPdu::WarfareFamilyPdu(&this->super_WarfareFamilyPdu);
  (this->super_WarfareFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__FirePdu_001b4c18;
  EntityID::EntityID(&this->_munitionExpendibleID);
  EventIdentifier::EventIdentifier(&this->_eventID);
  this->_fireMissionIndex = 0;
  Vector3Double::Vector3Double(&this->_locationInWorldCoordinates);
  MunitionDescriptor::MunitionDescriptor(&this->_descriptor);
  Vector3Float::Vector3Float(&this->_velocity);
  this->_range = 0.0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x02');
  return;
}

Assistant:

FirePdu::FirePdu() : WarfareFamilyPdu(),
   _munitionExpendibleID(), 
   _eventID(), 
   _fireMissionIndex(0), 
   _locationInWorldCoordinates(), 
   _descriptor(), 
   _velocity(), 
   _range(0.0)
{
    setPduType( 2 );
}